

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAdda<(moira::Instr)119,(moira::Mode)3,(moira::Size)4>(Moira *this,u16 opcode)

{
  int iVar1;
  bool bVar2;
  u32 uVar3;
  ulong uVar4;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  bVar2 = readOp<(moira::Mode)3,(moira::Size)4,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar2) {
    uVar4 = (ulong)(opcode >> 9 & 7);
    iVar1 = *(int *)((long)this->exec + uVar4 * 4 + -0x38);
    uVar3 = (this->reg).pc;
    (this->reg).pc0 = uVar3;
    (this->queue).ird = (this->queue).irc;
    uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
    (this->queue).irc = (u16)uVar3;
    (*this->_vptr_Moira[0x19])(this,2);
    *(u32 *)((long)this->exec + uVar4 * 4 + -0x38) = iVar1 - local_20;
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}